

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_int_scanfn(arg_int *parent,char *argval)

{
  char *str;
  int iVar1;
  long lVar2;
  long lVar3;
  char *end;
  char *local_28;
  
  if (parent->count == (parent->hdr).maxcount) {
    return 2;
  }
  local_28 = (char *)0x2;
  if (argval == (char *)0x0) {
    parent->count = parent->count + 1;
  }
  else {
    lVar2 = strtol0X(argval,&local_28,'X',0x10);
    if ((((local_28 == argval) && (lVar2 = strtol0X(argval,&local_28,'O',8), local_28 == argval)) &&
        (lVar2 = strtol0X(argval,&local_28,'B',2), local_28 == argval)) &&
       (lVar2 = strtol(argval,&local_28,10), local_28 == argval)) {
      return 3;
    }
    str = local_28;
    iVar1 = detectsuffix(local_28,"KB");
    if (iVar1 == 0) {
      iVar1 = detectsuffix(str,"MB");
      if (iVar1 == 0) {
        iVar1 = detectsuffix(str,"GB");
        if (iVar1 == 0) {
          iVar1 = detectsuffix(str,"");
          lVar3 = lVar2;
          if (iVar1 == 0) {
            return 3;
          }
        }
        else {
          if (lVar2 - 2U < 0xfffffffffffffffc) {
            return 4;
          }
          lVar3 = lVar2 << 0x1e;
        }
      }
      else {
        if (lVar2 - 0x800U < 0xfffffffffffff000) {
          return 4;
        }
        lVar3 = lVar2 << 0x14;
      }
    }
    else {
      if (lVar2 - 0x200000U < 0xffffffffffc00000) {
        return 4;
      }
      lVar3 = lVar2 << 10;
    }
    if (lVar2 + 0x80000000U >> 0x20 != 0) {
      return 4;
    }
    iVar1 = parent->count;
    parent->count = iVar1 + 1;
    parent->ival[iVar1] = (int)lVar3;
  }
  return 0;
}

Assistant:

static int arg_int_scanfn(struct arg_int* parent, const char* argval) {
    int errorcode = 0;

    if (parent->count == parent->hdr.maxcount) {
        /* maximum number of arguments exceeded */
        errorcode = ARG_ERR_MAXCOUNT;
    } else if (!argval) {
        /* a valid argument with no argument value was given. */
        /* This happens when an optional argument value was invoked. */
        /* leave parent arguiment value unaltered but still count the argument. */
        parent->count++;
    } else {
        long int val;
        const char* end;

        /* attempt to extract hex integer (eg: +0x123) from argval into val conversion */
        val = strtol0X(argval, &end, 'X', 16);
        if (end == argval) {
            /* hex failed, attempt octal conversion (eg +0o123) */
            val = strtol0X(argval, &end, 'O', 8);
            if (end == argval) {
                /* octal failed, attempt binary conversion (eg +0B101) */
                val = strtol0X(argval, &end, 'B', 2);
                if (end == argval) {
                    /* binary failed, attempt decimal conversion with no prefix (eg 1234) */
                    val = strtol(argval, (char**)&end, 10);
                    if (end == argval) {
                        /* all supported number formats failed */
                        return ARG_ERR_BADINT;
                    }
                }
            }
        }

        /* Safety check for integer overflow. WARNING: this check    */
        /* achieves nothing on machines where size(int)==size(long). */
        if (val > INT_MAX || val < INT_MIN)
            errorcode = ARG_ERR_OVERFLOW;

        /* Detect any suffixes (KB,MB,GB) and multiply argument value appropriately. */
        /* We need to be mindful of integer overflows when using such big numbers.   */
        if (detectsuffix(end, "KB")) /* kilobytes */
        {
            if (val > (INT_MAX / 1024) || val < (INT_MIN / 1024))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1024;                /* 1KB = 1024 */
        } else if (detectsuffix(end, "MB")) /* megabytes */
        {
            if (val > (INT_MAX / 1048576) || val < (INT_MIN / 1048576))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1048576;             /* 1MB = 1024*1024 */
        } else if (detectsuffix(end, "GB")) /* gigabytes */
        {
            if (val > (INT_MAX / 1073741824) || val < (INT_MIN / 1073741824))
                errorcode = ARG_ERR_OVERFLOW; /* Overflow would occur if we proceed */
            else
                val *= 1073741824; /* 1GB = 1024*1024*1024 */
        } else if (!detectsuffix(end, ""))
            errorcode = ARG_ERR_BADINT; /* invalid suffix detected */

        /* if success then store result in parent->ival[] array */
        if (errorcode == 0)
            parent->ival[parent->count++] = (int)val;
    }

    /* printf("%s:scanfn(%p,%p) returns %d\n",__FILE__,parent,argval,errorcode); */
    return errorcode;
}